

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O0

int priv_rsa_finish(RSA *rsa)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int local_48 [2];
  size_t ret;
  expbuf_t buf;
  st_neverbleed_thread_data_t *thdata;
  st_neverbleed_rsa_exdata_t *exdata;
  RSA *rsa_local;
  
  exdata = (st_neverbleed_rsa_exdata_t *)rsa;
  get_privsep_data(rsa,(st_neverbleed_rsa_exdata_t **)&thdata,
                   (st_neverbleed_thread_data_t **)&buf.capacity);
  memset(&ret,0,0x20);
  expbuf_push_str((expbuf_t *)&ret,"del_rsa_key");
  expbuf_push_num((expbuf_t *)&ret,(size_t)thdata[1]);
  iVar1 = expbuf_write((expbuf_t *)&ret,*(int *)(buf.capacity + 4));
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = "connection closed by daemon";
    if (*piVar2 != 0) {
      pcVar3 = "write error";
    }
    dief(pcVar3);
  }
  expbuf_dispose((expbuf_t *)&ret);
  iVar1 = expbuf_read((expbuf_t *)&ret,*(int *)(buf.capacity + 4));
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = "connection closed by daemon";
    if (*piVar2 != 0) {
      pcVar3 = "read error";
    }
    dief(pcVar3);
  }
  iVar1 = expbuf_shift_num((expbuf_t *)&ret,(size_t *)local_48);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    dief("failed to parse response");
  }
  expbuf_dispose((expbuf_t *)&ret);
  return local_48[0];
}

Assistant:

static int priv_rsa_finish(RSA *rsa)
{
    struct st_neverbleed_rsa_exdata_t *exdata;
    struct st_neverbleed_thread_data_t *thdata;

    get_privsep_data(rsa, &exdata, &thdata);

    struct expbuf_t buf = {NULL};
    size_t ret;

    expbuf_push_str(&buf, "del_rsa_key");
    expbuf_push_num(&buf, exdata->key_index);
    if (expbuf_write(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "write error" : "connection closed by daemon");
    expbuf_dispose(&buf);

    if (expbuf_read(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "read error" : "connection closed by daemon");
    if (expbuf_shift_num(&buf, &ret) != 0) {
        errno = 0;
        dief("failed to parse response");
    }
    expbuf_dispose(&buf);

    return (int)ret;
}